

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

UBool ucnv_extInitialMatchFromU_63
                (UConverter *cnv,int32_t *cx,UChar32 cp,UChar **src,UChar *srcLimit,char **target,
                char *targetLimit,int32_t **offsets,int32_t srcIndex,UBool flush,
                UErrorCode *pErrorCode)

{
  int local_54;
  undefined2 *puStack_50;
  int32_t j;
  UChar *s;
  int32_t match;
  uint32_t value;
  char **target_local;
  UChar *srcLimit_local;
  UChar **src_local;
  int32_t *piStack_20;
  UChar32 cp_local;
  int32_t *cx_local;
  UConverter *cnv_local;
  
  s._4_4_ = 0;
  _match = target;
  target_local = (char **)srcLimit;
  srcLimit_local = (UChar *)src;
  src_local._4_4_ = cp;
  piStack_20 = cx;
  cx_local = (int32_t *)cnv;
  s._0_4_ = ucnv_extMatchFromU(cx,cp,(UChar *)0x0,0,*src,(int32_t)((long)srcLimit - (long)*src >> 1)
                               ,(uint32_t *)((long)&s + 4),cnv->useFallback,flush);
  if (((int32_t)s < 2) ||
     (((s._4_4_ >> 0x18 & 0x1f) == 1 && (*(char *)(*(long *)(cx_local + 0xc) + 0xfc) == -0x25)))) {
    if ((int32_t)s < 0) {
      cx_local[0x34] = src_local._4_4_;
      puStack_50 = *(undefined2 **)srcLimit_local;
      for (local_54 = 0; local_54 < -2 - (int32_t)s; local_54 = local_54 + 1) {
        *(undefined2 *)((long)cx_local + (long)local_54 * 2 + 0xd4) = *puStack_50;
        puStack_50 = puStack_50 + 1;
      }
      *(undefined2 **)srcLimit_local = puStack_50;
      *(char *)((long)cx_local + 0x119) = (char)(-2 - (int32_t)s);
      cnv_local._7_1_ = '\x01';
    }
    else if ((int32_t)s == 1) {
      *(undefined1 *)((long)cx_local + 0x5f) = 1;
      cnv_local._7_1_ = '\0';
    }
    else {
      cnv_local._7_1_ = '\0';
    }
  }
  else {
    *(long *)srcLimit_local = *(long *)srcLimit_local + (long)((int32_t)s + -2) * 2;
    ucnv_extWriteFromU((UConverter *)cx_local,piStack_20,s._4_4_,_match,targetLimit,offsets,srcIndex
                       ,pErrorCode);
    cnv_local._7_1_ = '\x01';
  }
  return cnv_local._7_1_;
}

Assistant:

U_CFUNC UBool
ucnv_extInitialMatchFromU(UConverter *cnv, const int32_t *cx,
                          UChar32 cp,
                          const UChar **src, const UChar *srcLimit,
                          char **target, const char *targetLimit,
                          int32_t **offsets, int32_t srcIndex,
                          UBool flush,
                          UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    /* try to match */
    match=ucnv_extMatchFromU(cx, cp,
                             NULL, 0,
                             *src, (int32_t)(srcLimit-*src),
                             &value,
                             cnv->useFallback, flush);

    /* reject a match if the result is a single byte for DBCS-only */
    if( match>=2 &&
        !(UCNV_EXT_FROM_U_GET_LENGTH(value)==1 &&
          cnv->sharedData->mbcs.outputType==MBCS_OUTPUT_DBCS_ONLY)
    ) {
        /* advance src pointer for the consumed input */
        *src+=match-2; /* remove 2 for the initial code point */

        /* write result to target */
        ucnv_extWriteFromU(cnv, cx,
                           value,
                           target, targetLimit,
                           offsets, srcIndex,
                           pErrorCode);
        return TRUE;
    } else if(match<0) {
        /* save state for partial match */
        const UChar *s;
        int32_t j;

        /* copy the first code point */
        cnv->preFromUFirstCP=cp;

        /* now copy the newly consumed input */
        s=*src;
        match=-match-2; /* remove 2 for the initial code point */
        for(j=0; j<match; ++j) {
            cnv->preFromU[j]=*s++;
        }
        *src=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preFromULength=(int8_t)match;
        return TRUE;
    } else if(match==1) {
        /* matched, no mapping but request for <subchar1> */
        cnv->useSubChar1=TRUE;
        return FALSE;
    } else /* match==0 no match */ {
        return FALSE;
    }
}